

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O3

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:926:25)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  strand *psVar1;
  strand_service *this;
  anon_class_8_1_8991fb9c this_00;
  bool bVar2;
  TimerTickResult TVar3;
  size_t *psVar4;
  long *plVar5;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
  *op;
  allocator_type a;
  thread_info_base *this_thread;
  on_dispatch_exit on_exit;
  context ctx;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25),_std::error_code>
  handler;
  undefined1 local_a8 [8];
  error_code eStack_a0;
  on_dispatch_exit local_90;
  ptr local_80;
  ptr local_68;
  implementation_type local_50;
  implementation_type *local_48;
  error_code *local_40;
  anon_class_8_1_8991fb9c local_38;
  scheduler_operation *local_30;
  error_category *peStack_28;
  
  local_68.h = &local_38;
  local_38.this = *(Connection **)&base[1].task_result_;
  local_30 = base[1].next_;
  peStack_28 = (error_category *)base[1].func_;
  local_68.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)base;
  local_68.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)base;
  ptr::reset(&local_68);
  this_00.this = local_38.this;
  if (owner != (void *)0x0) {
    psVar1 = ((local_38.this)->AsioEventStrand)._M_t.
             super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
             .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl;
    eStack_a0._0_8_ = local_30;
    eStack_a0._M_cat = peStack_28;
    psVar4 = (size_t *)__tls_get_addr(&PTR_001cfc38);
    local_a8 = (undefined1  [8])this_00.this;
    this = psVar1->service_;
    plVar5 = (long *)*psVar4;
    if (plVar5 != (long *)0x0) {
      do {
        if ((implementation_type)*plVar5 == psVar1->impl_) {
          if (plVar5[1] != 0) {
            if (eStack_a0._M_value == 0) {
              TVar3 = tonk::Connection::onTimerTick(this_00.this);
              if (TVar3 == TickAgain) {
                tonk::Connection::postNextTimer(this_00.this);
              }
            }
            else {
              tonk::Connection::onTimerError(this_00.this,&eStack_a0);
            }
            goto LAB_0013eb01;
          }
          break;
        }
        plVar5 = (long *)plVar5[2];
      } while (plVar5 != (long *)0x0);
    }
    local_80.h = (type *)local_a8;
    plVar5 = (long *)__tls_get_addr();
    if (*plVar5 == 0) {
      this_thread = (thread_info_base *)0x0;
    }
    else {
      this_thread = *(thread_info_base **)(*plVar5 + 8);
    }
    op = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
          *)thread_info_base::allocate(this_thread,0x30);
    (op->super_operation).next_ = (scheduler_operation *)0x0;
    (op->super_operation).func_ =
         completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
         ::do_complete;
    (op->super_operation).task_result_ = 0;
    (op->handler_).this = (Connection *)local_a8;
    (op->handler_).error._M_value = eStack_a0._M_value;
    *(undefined4 *)&(op->handler_).error.field_0x4 = eStack_a0._4_4_;
    (op->handler_).error._M_cat = eStack_a0._M_cat;
    local_80.v = op;
    local_80.p = op;
    bVar2 = strand_service::do_dispatch(this,&psVar1->impl_,(operation *)op);
    local_80.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
                  *)0x0;
    local_80.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
                  *)0x0;
    if (bVar2) {
      local_90.impl_ = psVar1->impl_;
      local_40 = (error_code *)*psVar4;
      local_48 = &local_50;
      *psVar4 = (size_t)local_48;
      local_90.io_context_ = this->io_context_;
      local_50 = local_90.impl_;
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
      ::do_complete(local_90.io_context_,(operation *)op,local_40,(size_t)local_48);
      strand_service::on_dispatch_exit::~on_dispatch_exit(&local_90);
      *psVar4 = (size_t)local_40;
    }
    completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
    ::ptr::reset(&local_80);
  }
LAB_0013eb01:
  ptr::reset(&local_68);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }